

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::killDuplicateBegin
          (InvocationInterlockPlacementPass *this,BasicBlock *block)

{
  bool bVar1;
  bool found;
  undefined1 local_49;
  inst_iterator local_48;
  inst_iterator local_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_38._M_unused._M_object = &local_49;
  local_49 = 0;
  local_40.super_iterator.node_ =
       (iterator)
       (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
       super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_48.super_iterator.node_ =
       (iterator)&(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:101:37)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:101:37)>
             ::_M_manager;
  bVar1 = IRContext::KillInstructionIf
                    ((this->super_Pass).context_,&local_40,&local_48,
                     (function<bool_(spvtools::opt::Instruction_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return bVar1;
}

Assistant:

bool InvocationInterlockPlacementPass::killDuplicateBegin(BasicBlock* block) {
  bool found = false;

  return context()->KillInstructionIf(
      block->begin(), block->end(), [&found](Instruction* inst) {
        if (inst->opcode() == spv::Op::OpBeginInvocationInterlockEXT) {
          if (found) {
            return true;
          }
          found = true;
        }
        return false;
      });
}